

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<Assimp::FICDATAValue> Assimp::FICDATAValue::create(string *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FICDATAValue> sVar2;
  _Alloc_hider local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<Assimp::FICDATAValueImpl,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->_M_dataplus)._M_p = local_18._M_p;
  value->_M_string_length = (size_type)_Var1._M_pi;
  local_18._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  sVar2.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)value;
  return (shared_ptr<Assimp::FICDATAValue>)
         sVar2.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FICDATAValue> FICDATAValue::create(std::string &&value) {
    return std::make_shared<FICDATAValueImpl>(std::move(value));
}